

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

char * read_line(FILE *file)

{
  int iVar1;
  void *__ptr;
  char *pcVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  
  lVar5 = 0x100000000;
  __ptr = malloc(0x100);
  iVar3 = 0x100;
  uVar4 = 0;
  while( true ) {
    iVar1 = fgetc((FILE *)file);
    if ((long)iVar3 <= (long)uVar4) {
      iVar3 = iVar3 + 0x100;
      __ptr = realloc(__ptr,(long)iVar3);
    }
    if ((iVar1 == -1) || (iVar1 == 10)) break;
    *(char *)((long)__ptr + uVar4) = (char)iVar1;
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 0x100000000;
  }
  *(undefined1 *)((long)__ptr + (uVar4 & 0xffffffff)) = 0;
  pcVar2 = (char *)realloc(__ptr,lVar5 >> 0x20);
  return pcVar2;
}

Assistant:

char *read_line(FILE *file)
{
	int size = BLOCK_SIZE;
	char *res = malloc(BLOCK_SIZE * sizeof(char));
	int ch;
	int i = 0;
	int isEnd = 0;
	do
	{
		ch = fgetc(file);
		if (i >= size)
		{
			size += BLOCK_SIZE;
			res = realloc(res, size * sizeof(char));
		}
		if (ch == '\n' || ch == EOF)
		{
			res[i++] = '\0';
			isEnd = 1;
		}
		else
		{
			res[i++] = (char) ch;
		}
	} while (!isEnd);
	if (i > 0 && res[i - 1] == '\r')
    {
        res[i - 1] = '\0';
        i--;
    }
	return realloc(res, i * sizeof(char));
}